

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_json.c
# Opt level: O2

char * uo_json_find_str_end(char *json_str)

{
  bool bVar1;
  char *pcVar2;
  bool bVar3;
  
  do {
    json_str = strchr(json_str + 1,0x22);
    if (json_str == (char *)0x0) break;
    pcVar2 = json_str;
    bVar1 = false;
    do {
      bVar3 = bVar1;
      pcVar2 = pcVar2 + -1;
      bVar1 = (bool)(bVar3 ^ 1);
    } while (*pcVar2 == '\\');
  } while (bVar3);
  pcVar2 = json_str + 1;
  if (json_str == (char *)0x0) {
    pcVar2 = (char *)0x0;
  }
  return pcVar2;
}

Assistant:

static char *uo_json_find_str_end(
    const char *json_str)
{
    const char *quote = strchr(json_str + 1, '\"');

    while (quote && uo_json_is_char_escaped(quote))
        quote = strchr(quote + 1, '\"');

    return quote
        ? (char *)quote + 1
        : NULL;
}